

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_0::ClearAttachmentTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ClearAttachmentTestInstance *this)

{
  VkClearValue *pVVar1;
  TestParams_conflict *pTVar2;
  DeviceInterface *pDVar3;
  VkCommandBuffer_s *pVVar4;
  uint uVar5;
  VkCommandBuffer_s **ppVVar6;
  size_type sVar7;
  reference pvVar8;
  uint x_;
  uint y_;
  uint uVar9;
  allocator<char> local_119;
  string local_118;
  VkClearDepthStencilValue local_f8;
  undefined8 uStack_f0;
  VkImageLayout local_e4;
  VkAccessFlags local_e0;
  VkImageLayout attachmentLayout;
  VkAccessFlags accessMask;
  uint uStack_d4;
  bool isDepthStencil;
  VkClearRect rects [2];
  deUint32 clearHeight;
  deUint32 clearWidth;
  deUint32 clearY;
  deUint32 clearX;
  undefined1 local_78 [8];
  VkClearRect rect;
  vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_> clearRects;
  UVec4 clearCoords;
  VkImageAspectFlags local_30 [2];
  VkClearAttachment clearAttachment;
  ClearAttachmentTestInstance *this_local;
  
  local_30[0] = (this->super_ImageClearingTestInstance).m_imageAspectFlags;
  local_30[1] = 0;
  pTVar2 = (this->super_ImageClearingTestInstance).m_params;
  clearAttachment._0_8_ = pTVar2->clearValue[0].depthStencil;
  clearAttachment.clearValue.depthStencil =
       *(VkClearDepthStencilValue *)((long)pTVar2->clearValue + 8);
  clearAttachment.clearValue._8_8_ = this;
  tcu::Vector<unsigned_int,_4>::Vector
            ((Vector<unsigned_int,_4> *)
             &clearRects.super__Vector_base<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>::vector
            ((vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_> *)&rect.baseArrayLayer);
  if (this->m_clearType == FULL_CLEAR) {
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    rect.rect.offset.x = (((this->super_ImageClearingTestInstance).m_params)->imageExtent).width;
    rect.rect.offset.y = (((this->super_ImageClearingTestInstance).m_params)->imageExtent).height;
    rect.rect.extent.width = 0;
    rect.rect.extent.height = 1;
    std::vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>::push_back
              ((vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_> *)&rect.baseArrayLayer,
               (value_type *)local_78);
  }
  else {
    x_ = (((this->super_ImageClearingTestInstance).m_params)->imageExtent).width >> 2;
    y_ = (((this->super_ImageClearingTestInstance).m_params)->imageExtent).height >> 2;
    uVar9 = (((this->super_ImageClearingTestInstance).m_params)->imageExtent).width >> 1;
    uVar5 = (((this->super_ImageClearingTestInstance).m_params)->imageExtent).height >> 1;
    tcu::Vector<unsigned_int,_4>::Vector
              ((Vector<unsigned_int,_4> *)&rects[1].layerCount,x_,y_,x_ + uVar9,y_ + uVar5);
    clearRects.super__Vector_base<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = stack0xffffffffffffff5c;
    accessMask = 0;
    rects[0].rect.offset.x = (((this->super_ImageClearingTestInstance).m_params)->imageExtent).width
    ;
    rects[0].rect.extent.width = 0;
    rects[0].rect.extent.height = 1;
    rects[0].layerCount = 0;
    rects[1].rect.offset.y =
         (((this->super_ImageClearingTestInstance).m_params)->imageExtent).height;
    rects[1].rect.extent.width = 0;
    rects[1].rect.extent.height = 1;
    uStack_d4 = y_;
    rects[0].rect.offset.y = uVar5;
    rects[0].baseArrayLayer = x_;
    rects[1].rect.offset.x = uVar9;
    std::vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>::push_back
              ((vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_> *)&rect.baseArrayLayer,
               (value_type *)&accessMask);
    std::vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>::push_back
              ((vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_> *)&rect.baseArrayLayer,
               (value_type *)&rects[0].baseArrayLayer);
  }
  attachmentLayout._3_1_ =
       ::vk::isDepthStencilFormat(((this->super_ImageClearingTestInstance).m_params)->imageFormat);
  local_e0 = 0x100;
  if ((bool)attachmentLayout._3_1_) {
    local_e0 = 0x400;
  }
  local_e4 = (byte)attachmentLayout._3_1_ | VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  ImageClearingTestInstance::beginCommandBuffer(&this->super_ImageClearingTestInstance,0);
  ImageClearingTestInstance::pipelineImageBarrier
            (&this->super_ImageClearingTestInstance,1,0x10000,0,local_e0,VK_IMAGE_LAYOUT_UNDEFINED,
             local_e4);
  pTVar2 = (this->super_ImageClearingTestInstance).m_params;
  pVVar1 = &pTVar2->initValue;
  local_f8 = pVVar1->depthStencil;
  uStack_f0 = *(undefined8 *)((long)&pTVar2->initValue + 8);
  ImageClearingTestInstance::beginRenderPass
            (&this->super_ImageClearingTestInstance,VK_SUBPASS_CONTENTS_INLINE,*pVVar1);
  pDVar3 = (this->super_ImageClearingTestInstance).m_vkd;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_ImageClearingTestInstance).m_commandBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar4 = *ppVVar6;
  sVar7 = std::vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>::size
                    ((vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_> *)
                     &rect.baseArrayLayer);
  pvVar8 = std::vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>::operator[]
                     ((vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_> *)
                      &rect.baseArrayLayer,0);
  (*pDVar3->_vptr_DeviceInterface[0x68])(pDVar3,pVVar4,1,local_30,sVar7 & 0xffffffff,pvVar8);
  pDVar3 = (this->super_ImageClearingTestInstance).m_vkd;
  ppVVar6 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_ImageClearingTestInstance).m_commandBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar3->_vptr_DeviceInterface[0x76])(pDVar3,*ppVVar6);
  ImageClearingTestInstance::pipelineImageBarrier
            (&this->super_ImageClearingTestInstance,0x8000,0x1000,local_e0,0x800,local_e4,
             VK_IMAGE_LAYOUT_GENERAL);
  ImageClearingTestInstance::endCommandBuffer(&this->super_ImageClearingTestInstance);
  ImageClearingTestInstance::submitCommandBuffer(&this->super_ImageClearingTestInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"cmdClearAttachments passed",&local_119);
  ImageClearingTestInstance::verifyResultImage
            (__return_storage_ptr__,&this->super_ImageClearingTestInstance,&local_118,
             (UVec4 *)&clearRects.
                       super__Vector_base<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>::~vector
            ((vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_> *)&rect.baseArrayLayer);
  return __return_storage_ptr__;
}

Assistant:

TestStatus iterate (void)
	{
		const VkClearAttachment clearAttachment =
		{
			m_imageAspectFlags,					// VkImageAspectFlags	aspectMask;
			0u,									// deUint32				colorAttachment;
			m_params.clearValue[0]				// VkClearValue			clearValue;
		};

		UVec4						clearCoords;
		std::vector<VkClearRect>	clearRects;

		if (m_clearType == FULL_CLEAR)
		{
			const VkClearRect rect =
			{
				{
					{ 0, 0 },																	// VkOffset2D    offset;
					{ m_params.imageExtent.width, m_params.imageExtent.height }					// VkExtent2D    extent;
				},																			// VkRect2D	rect;
				0u,																			// deUint32	baseArrayLayer;
				1u																			// deUint32	layerCount;
			};

			clearRects.push_back(rect);
		}
		else
		{
			const deUint32	clearX		= m_params.imageExtent.width  / 4u;
			const deUint32	clearY		= m_params.imageExtent.height / 4u;
			const deUint32	clearWidth	= m_params.imageExtent.width  / 2u;
			const deUint32	clearHeight	= m_params.imageExtent.height / 2u;

			clearCoords	= UVec4(clearX,					clearY,
								clearX + clearWidth,	clearY + clearHeight);

			const VkClearRect rects[2] =
			{
				{
					{
						{ 0,							static_cast<deInt32>(clearY)	},		// VkOffset2D    offset;
						{ m_params.imageExtent.width,	clearHeight						}		// VkExtent2D    extent;
					},																		// VkRect2D	rect;
					0u,																		// deUint32	baseArrayLayer;
					1u																		// deUint32	layerCount;
				},
				{
					{
						{ static_cast<deInt32>(clearX),	0							},			// VkOffset2D    offset;
						{ clearWidth,					m_params.imageExtent.height	}			// VkExtent2D    extent;
					},																		// VkRect2D	rect;
					0u,																		// deUint32	baseArrayLayer;
					1u																		// deUint32	layerCount;
				}
			};

			clearRects.push_back(rects[0]);
			clearRects.push_back(rects[1]);
		}

		const bool			isDepthStencil		= isDepthStencilFormat(m_params.imageFormat);
		const VkAccessFlags	accessMask			= (isDepthStencil ? VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT     : VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
		const VkImageLayout	attachmentLayout	= (isDepthStencil ? VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL : VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);

		beginCommandBuffer(0);

		pipelineImageBarrier(VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT,				// VkPipelineStageFlags		srcStageMask
							 VK_PIPELINE_STAGE_ALL_COMMANDS_BIT,			// VkPipelineStageFlags		dstStageMask
							 0,												// VkAccessFlags			srcAccessMask
							 accessMask,									// VkAccessFlags			dstAccessMask
							 VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
							 attachmentLayout);								// VkImageLayout			newLayout;

		beginRenderPass(VK_SUBPASS_CONTENTS_INLINE, m_params.initValue);
		m_vkd.cmdClearAttachments(*m_commandBuffer, 1, &clearAttachment, static_cast<deUint32>(clearRects.size()), &clearRects[0]);
		m_vkd.cmdEndRenderPass(*m_commandBuffer);

		pipelineImageBarrier(VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT,			// VkPipelineStageFlags		srcStageMask
							 VK_PIPELINE_STAGE_TRANSFER_BIT,				// VkPipelineStageFlags		dstStageMask
							 accessMask,									// VkAccessFlags			srcAccessMask
							 VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			dstAccessMask
							 attachmentLayout,								// VkImageLayout			oldLayout;
							 VK_IMAGE_LAYOUT_GENERAL);						// VkImageLayout			newLayout;

		endCommandBuffer();
		submitCommandBuffer();

		return verifyResultImage("cmdClearAttachments passed", clearCoords);
	}